

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

uint32 __thiscall Clasp::SharedContext::problemComplexity(SharedContext *this)

{
  Solver *pSVar1;
  int iVar2;
  uint32 r;
  uint32 uVar3;
  uint32 i;
  uint uVar4;
  
  uVar3 = (this->btig_).tern_[0] + (this->btig_).bin_[0];
  if ((this->stats_).vars.frozen == 0) {
    uVar3 = uVar3 + ((*(this->solvers_).ebo_.buf)->constraints_).ebo_.size;
  }
  else {
    for (uVar4 = 0; pSVar1 = *(this->solvers_).ebo_.buf, uVar4 != (pSVar1->constraints_).ebo_.size;
        uVar4 = uVar4 + 1) {
      iVar2 = (*(pSVar1->constraints_).ebo_.buf[uVar4]->_vptr_Constraint[8])();
      uVar3 = uVar3 + iVar2;
    }
  }
  return uVar3;
}

Assistant:

uint32 SharedContext::problemComplexity() const {
	if (isExtended()) {
		uint32 r = numBinary() + numTernary();
		for (uint32 i = 0; i != master()->constraints_.size(); ++i) {
			r += master()->constraints_[i]->estimateComplexity(*master());
		}
		return r;
	}
	return numConstraints();
}